

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

iterator * __thiscall ghc::filesystem::path::iterator::operator++(iterator *this)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  char *pcVar6;
  bool bVar7;
  
  pcVar1 = (this->_iter)._M_current;
  _Var5._M_current = pcVar1;
  if ((this->_first)._M_current == pcVar1) {
    pcVar6 = (this->_last)._M_current;
    if ((pcVar6 == pcVar1) ||
       (_Var5._M_current = (this->_prefix)._M_current, pcVar1 < _Var5._M_current))
    goto LAB_00106a26;
    bVar7 = true;
    if (*pcVar1 == '/') goto LAB_001069cd;
LAB_00106a04:
    if ((pcVar1 + 1 != pcVar6) && (pcVar1[1] == ':')) {
      _Var5._M_current = pcVar1 + 2;
      goto LAB_00106a26;
    }
LAB_00106a17:
    pcVar4 = pcVar1 + 1;
  }
  else {
    pcVar6 = (this->_last)._M_current;
    pcVar3 = (this->_prefix)._M_current;
    bVar7 = pcVar3 == pcVar1;
    if (pcVar6 == pcVar1) goto LAB_00106a26;
    if (*pcVar1 != '/') {
      if (pcVar3 == pcVar1) goto LAB_00106a04;
      goto LAB_00106a17;
    }
LAB_001069cd:
    pcVar3 = pcVar1 + 1;
    _Var5._M_current = pcVar3;
    if ((pcVar3 == pcVar6) || (*pcVar3 != '/')) goto LAB_00106a26;
    if ((!bVar7) || ((pcVar4 = pcVar1 + 2, pcVar4 != pcVar6 && (*pcVar4 == '/')))) {
      lVar2 = 1 - (long)pcVar3;
      do {
        _Var5._M_current = pcVar3;
        if (*pcVar3 != '/') break;
        pcVar3 = pcVar3 + 1;
        _Var5._M_current = pcVar1 + (long)(pcVar6 + lVar2);
      } while (pcVar3 != pcVar6);
      goto LAB_00106a26;
    }
  }
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar4,pcVar6,
                     "/St15_Sp_counted_ptrIPN3ghc10filesystem28recursive_directory_iterator33recursive_directory_iterator_implELN9__gnu_cxx12_Lock_policyE2EE"
                    );
LAB_00106a26:
  pcVar1 = (this->_last)._M_current;
  do {
    (this->_iter)._M_current = _Var5._M_current;
    if (((_Var5._M_current == pcVar1) || (_Var5._M_current == (this->_root)._M_current)) ||
       (*_Var5._M_current != '/')) break;
    _Var5._M_current = _Var5._M_current + 1;
  } while (_Var5._M_current != pcVar1);
  updateCurrent(this);
  return this;
}

Assistant:

GHC_INLINE path::iterator& path::iterator::operator++()
{
    _iter = increment(_iter);
    while (_iter != _last &&                // we didn't reach the end
           _iter != _root &&                // this is not a root position
           *_iter == preferred_separator &&  // we are on a separator
           (_iter + 1) != _last             // the slash is not the last char
    ) {
        ++_iter;
    }
    updateCurrent();
    return *this;
}